

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall wasm::PrintSExpression::visitDataSegment(PrintSExpression *this,DataSegment *curr)

{
  Module *pMVar1;
  pointer puVar2;
  pointer pcVar3;
  ostream *poVar4;
  ostream *in_RCX;
  Name name;
  Name name_00;
  string_view str;
  
  doIndent(this->o,this->indent);
  std::operator<<(this->o,'(');
  printMajor(this->o,"data ");
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(curr->super_Named).name.super_IString.str._M_str;
  anon_unknown_217::printName
            ((anon_unknown_217 *)(curr->super_Named).name.super_IString.str._M_len,name,in_RCX);
  std::operator<<(this->o,' ');
  if (curr->isPassive != false) goto LAB_00924331;
  pMVar1 = this->currModule;
  if (pMVar1 == (Module *)0x0) {
LAB_009242ec:
    poVar4 = std::operator<<(this->o,"(memory $");
    name_00.super_IString.str._M_str = (char *)in_RCX;
    name_00.super_IString.str._M_len = (size_t)(curr->memory).super_IString.str._M_str;
    poVar4 = wasm::operator<<((wasm *)poVar4,(ostream *)(curr->memory).super_IString.str._M_len,
                              name_00);
    std::operator<<(poVar4,") ");
  }
  else {
    puVar2 = (pMVar1->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pMVar1->memories).
        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == puVar2) {
      __assert_fail("!currModule || currModule->memories.size() > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                    ,0xd15,"void wasm::PrintSExpression::visitDataSegment(DataSegment *)");
    }
    in_RCX = (ostream *)(curr->memory).super_IString.str._M_str;
    if (in_RCX != *(ostream **)
                   ((long)&(((puVar2->_M_t).
                             super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                             .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->
                           super_Importable).super_Named + 8)) goto LAB_009242ec;
  }
  visit(this,curr->offset);
  std::operator<<(this->o,' ');
LAB_00924331:
  pcVar3 = (curr->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  str._M_str = (char *)in_RCX;
  str._M_len = (size_t)pcVar3;
  anon_unknown_217::printEscapedString
            ((anon_unknown_217 *)this->o,
             (ostream *)
             ((curr->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish + -(long)pcVar3),str);
  poVar4 = std::operator<<(this->o,')');
  std::operator<<(poVar4,this->maybeNewLine);
  return;
}

Assistant:

void visitDataSegment(DataSegment* curr) {
    doIndent(o, indent);
    o << '(';
    printMajor(o, "data ");
    printName(curr->name, o);
    o << ' ';
    if (!curr->isPassive) {
      assert(!currModule || currModule->memories.size() > 0);
      if (!currModule || curr->memory != currModule->memories[0]->name) {
        o << "(memory $" << curr->memory << ") ";
      }
      visit(curr->offset);
      o << ' ';
    }
    printEscapedString(o, {curr->data.data(), curr->data.size()});
    o << ')' << maybeNewLine;
  }